

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  ImGuiNavLayer IVar1;
  ImGuiWindow *window;
  ImGuiViewportP *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImVec2 *pIVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pIVar3 = GImGui;
  if ((GImGui->NavDisableHighlight == false) &&
     (window = GImGui->NavWindow, (GImGui->NavDisableMouseHover & window != (ImGuiWindow *)0x0) != 0
     )) {
    IVar1 = GImGui->NavLayer;
    fVar9 = (window->DC).CursorStartPos.x;
    fVar11 = (window->DC).CursorStartPos.y;
    fVar10 = window->NavRectRel[IVar1].Min.x + fVar9;
    fVar12 = window->NavRectRel[IVar1].Min.y + fVar11;
    fVar9 = fVar9 + window->NavRectRel[IVar1].Max.x;
    fVar11 = fVar11 + window->NavRectRel[IVar1].Max.y;
    if ((window->LastFrameActive != GImGui->FrameCount) &&
       ((((fVar7 = (window->ScrollTarget).x, fVar7 != 3.4028235e+38 || (NAN(fVar7))) ||
         (fVar7 = (window->ScrollTarget).y, fVar7 != 3.4028235e+38)) || (NAN(fVar7))))) {
      IVar6 = CalcNextScrollFromScrollTargetAndClamp(window);
      fVar7 = (window->Scroll).x - IVar6.x;
      fVar8 = (window->Scroll).y - IVar6.y;
      fVar10 = fVar10 + fVar7;
      fVar12 = fVar12 + fVar8;
      fVar9 = fVar9 + fVar7;
      fVar11 = fVar11 + fVar8;
    }
    fVar8 = (pIVar3->Style).FramePadding.x * 4.0;
    fVar7 = (pIVar3->Style).FramePadding.y;
    if (fVar9 - fVar10 <= fVar8) {
      fVar8 = fVar9 - fVar10;
    }
    fVar8 = fVar8 + fVar10;
    if (fVar11 - fVar12 <= fVar7) {
      fVar7 = fVar11 - fVar12;
    }
    fVar11 = fVar11 - fVar7;
    pIVar2 = window->Viewport;
    fVar9 = (pIVar2->super_ImGuiViewport).Pos.x;
    fVar10 = (pIVar2->super_ImGuiViewport).Pos.y;
    fVar12 = (pIVar2->super_ImGuiViewport).Size.x + fVar9;
    fVar7 = (pIVar2->super_ImGuiViewport).Size.y + fVar10;
    if (fVar11 <= fVar7) {
      fVar7 = fVar11;
    }
    if (fVar8 <= fVar12) {
      fVar12 = fVar8;
    }
    fVar12 = (float)(int)(float)(-(uint)(fVar8 < fVar9) & (uint)fVar9 |
                                ~-(uint)(fVar8 < fVar9) & (uint)fVar12);
    fVar9 = (float)(int)(float)(-(uint)(fVar11 < fVar10) & (uint)fVar10 |
                               ~-(uint)(fVar11 < fVar10) & (uint)fVar7);
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar4 = IsMousePosValid(mouse_pos);
    pIVar5 = &pIVar3->MouseLastValidPos;
    if (bVar4) {
      pIVar5 = mouse_pos;
    }
    fVar9 = pIVar5->y;
    fVar12 = pIVar5->x + 1.0;
  }
  IVar6.y = fVar9;
  IVar6.x = fVar12;
  return IVar6;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !window)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        // The +1.0f offset when stored by OpenPopupEx() allows reopening this or another popup (same or another mouse button) while not moving the mouse, it is pretty standard.
        // In theory we could move that +1.0f offset in OpenPopupEx()
        ImVec2 p = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : g.MouseLastValidPos;
        return ImVec2(p.x + 1.0f, p.y);
    }
    else
    {
        // When navigation is active and mouse is disabled, pick a position around the bottom left of the currently navigated item
        // Take account of upcoming scrolling (maybe set mouse pos should be done in EndFrame?)
        ImRect rect_rel = WindowRectRelToAbs(window, window->NavRectRel[g.NavLayer]);
        if (window->LastFrameActive != g.FrameCount && (window->ScrollTarget.x != FLT_MAX || window->ScrollTarget.y != FLT_MAX))
        {
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
            rect_rel.Translate(window->Scroll - next_scroll);
        }
        ImVec2 pos = ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = window->Viewport;
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}